

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O3

long __thiscall gl4cts::anon_unknown_0::BasicOperationsBaseCS::Run(BasicOperationsBaseCS *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  int iVar2;
  GLuint program;
  GLint GVar3;
  undefined4 extraout_var;
  size_t sVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  byte bVar8;
  ulong uVar9;
  long lVar10;
  vector<unsigned_char,_std::allocator<unsigned_char>_> expected_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> in_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> zero;
  stringstream ss;
  allocator_type local_209;
  void *local_208;
  void *pvStack_200;
  long local_1f8;
  void *local_1e8;
  long lStack_1e0;
  long local_1d8;
  string local_1c8;
  stringstream local_1a8 [16];
  undefined1 local_198 [376];
  char *__s;
  
  local_1e8 = (void *)0x0;
  lStack_1e0 = 0;
  local_1d8 = 0;
  local_1f8 = 0;
  local_208 = (void *)0x0;
  pvStack_200 = (void *)0x0;
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"layout(local_size_x = 1) in;\n",0x1d);
  iVar2 = (*(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
            _vptr_GLWrapper[9])(this,&local_1e8,&local_208);
  __s = (char *)CONCAT44(extraout_var,iVar2);
  if (__s == (char *)0x0) {
    std::ios::clear((int)(ostream *)local_198 + (int)*(_func_int **)(local_198._0_8_ + -0x18));
  }
  else {
    sVar4 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,__s,sVar4);
  }
  std::__cxx11::stringbuf::str();
  program = ShaderStorageBufferObjectBase::CreateProgramCS
                      (&this->super_ShaderStorageBufferObjectBase,&local_1c8);
  this->m_program = program;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    program = this->m_program;
  }
  this_00 = &(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,program);
  bVar1 = ShaderStorageBufferObjectBase::CheckProgram
                    (&this->super_ShaderStorageBufferObjectBase,this->m_program);
  lVar10 = -1;
  if (bVar1) {
    glu::CallLogWrapper::glGenBuffers(this_00,2,this->m_buffer);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1c8,
               (long)pvStack_200 - (long)local_208,&local_209);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,1,this->m_buffer[1]);
    glu::CallLogWrapper::glBufferData
              (this_00,0x90d2,(long)pvStack_200 - (long)local_208,local_1c8._M_dataplus._M_p,0x88e4)
    ;
    if (local_1c8._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_1c8._M_dataplus._M_p,
                      local_1c8.field_2._M_allocated_capacity - (long)local_1c8._M_dataplus._M_p);
    }
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_buffer[0]);
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,lStack_1e0 - (long)local_1e8,local_1e8,0x88e4);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
    GVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_value0");
    glu::CallLogWrapper::glUniform3f(this_00,GVar3,10.0,20.0,30.0);
    GVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_index1");
    glu::CallLogWrapper::glUniform1i(this_00,GVar3,1);
    GVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_index2");
    glu::CallLogWrapper::glUniform1i(this_00,GVar3,2);
    glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_buffer[1]);
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
    pvVar5 = glu::CallLogWrapper::glMapBufferRange
                       (this_00,0x90d2,0,(long)pvStack_200 - (long)local_208,1);
    if (pvVar5 != (void *)0x0) {
      if (pvStack_200 == local_208) {
        uVar9 = 0;
      }
      else {
        bVar8 = 1;
        uVar9 = 0;
        pvVar6 = local_208;
        pvVar7 = pvStack_200;
        do {
          if (*(char *)((long)pvVar6 + uVar9) != *(char *)((long)pvVar5 + uVar9)) {
            anon_unknown_0::Output("Byte at index %3d is %2x should be %2x.\n",uVar9 & 0xffffffff);
            bVar8 = 0;
            pvVar6 = local_208;
            pvVar7 = pvStack_200;
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 < (ulong)((long)pvVar7 - (long)pvVar6));
        uVar9 = (ulong)(~bVar8 & 1);
      }
      glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
      lVar10 = -uVar9;
    }
  }
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
  if (local_208 != (void *)0x0) {
    operator_delete(local_208,local_1f8 - (long)local_208);
  }
  if (local_1e8 != (void *)0x0) {
    operator_delete(local_1e8,local_1d8 - (long)local_1e8);
  }
  return lVar10;
}

Assistant:

virtual long Run()
	{
		std::vector<GLubyte> in_data;
		std::vector<GLubyte> expected_data;

		std::stringstream ss;
		ss << "layout(local_size_x = 1) in;\n" << GetInput(in_data, expected_data);
		m_program = CreateProgramCS(ss.str());
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(2, m_buffer);

		/* output buffer */
		{
			std::vector<GLubyte> zero(expected_data.size());
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_buffer[1]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)expected_data.size(), &zero[0], GL_STATIC_DRAW);
		}
		// input buffer
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_buffer[0]);
		glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)in_data.size(), &in_data[0], GL_STATIC_DRAW);

		glUseProgram(m_program);
		glUniform3f(glGetUniformLocation(m_program, "g_value0"), 10.0, 20.0, 30.0);
		glUniform1i(glGetUniformLocation(m_program, "g_index1"), 1);
		glUniform1i(glGetUniformLocation(m_program, "g_index2"), 2);
		glDispatchCompute(1, 1, 1);

		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_buffer[1]);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		GLubyte* out_data =
			(GLubyte*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, (GLsizeiptr)expected_data.size(), GL_MAP_READ_BIT);
		if (!out_data)
			return ERROR;

		bool status = true;
		for (size_t i = 0; i < expected_data.size(); ++i)
		{
			if (expected_data[i] != out_data[i])
			{
				Output("Byte at index %3d is %2x should be %2x.\n", static_cast<int>(i), out_data[i], expected_data[i]);
				status = false;
			}
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		if (!status)
			return ERROR;
		return NO_ERROR;
	}